

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gamecore.cpp
# Opt level: O0

void __thiscall CCharacterCore::AddDragVelocity(CCharacterCore *this)

{
  long *in_RDI;
  float fVar1;
  float fVar2;
  float DragSpeed;
  
  fVar1 = CTuneParam::operator_cast_to_float((CTuneParam *)(*in_RDI + 0x2c));
  fVar2 = SaturatedAdd<float>(-fVar1,fVar1,*(float *)(in_RDI + 3),*(float *)(in_RDI + 4));
  *(float *)(in_RDI + 3) = fVar2;
  fVar1 = SaturatedAdd<float>(-fVar1,fVar1,*(float *)((long)in_RDI + 0x1c),
                              *(float *)((long)in_RDI + 0x24));
  *(float *)((long)in_RDI + 0x1c) = fVar1;
  return;
}

Assistant:

void CCharacterCore::AddDragVelocity()
{
	// Apply hook interaction velocity
	float DragSpeed = m_pWorld->m_Tuning.m_HookDragSpeed;

	m_Vel.x = SaturatedAdd(-DragSpeed, DragSpeed, m_Vel.x, m_HookDragVel.x);
	m_Vel.y = SaturatedAdd(-DragSpeed, DragSpeed, m_Vel.y, m_HookDragVel.y);
}